

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

SUNNonlinearSolver SUNNonlinSol_FixedPoint(N_Vector y,int m)

{
  int iVar1;
  _generic_N_Vector_Ops *__ptr;
  undefined8 *__s;
  int retval;
  SUNNonlinearSolverContent_FixedPoint content;
  SUNNonlinearSolver_Ops ops;
  SUNNonlinearSolver NLS;
  int m_local;
  N_Vector y_local;
  
  if (y == (N_Vector)0x0) {
    y_local = (N_Vector)0x0;
  }
  else if ((((y->ops->nvclone == (_func_N_Vector_N_Vector *)0x0) ||
            (y->ops->nvdestroy == (_func_void_N_Vector *)0x0)) ||
           (y->ops->nvscale == (_func_void_realtype_N_Vector_N_Vector *)0x0)) ||
          ((y->ops->nvlinearsum == (_func_void_realtype_N_Vector_realtype_N_Vector_N_Vector *)0x0 ||
           (y->ops->nvdotprod == (_func_realtype_N_Vector_N_Vector *)0x0)))) {
    y_local = (N_Vector)0x0;
  }
  else {
    y_local = (N_Vector)malloc(0x10);
    if (y_local == (N_Vector)0x0) {
      y_local = (N_Vector)0x0;
    }
    else {
      __ptr = (_generic_N_Vector_Ops *)malloc(0x68);
      if (__ptr == (_generic_N_Vector_Ops *)0x0) {
        free(y_local);
        y_local = (N_Vector)0x0;
      }
      else {
        __s = (undefined8 *)malloc(0x98);
        if (__s == (undefined8 *)0x0) {
          free(__ptr);
          free(y_local);
          y_local = (N_Vector)0x0;
        }
        else {
          y_local->content = __s;
          y_local->ops = __ptr;
          __ptr->nvgetvectorid = SUNNonlinSolGetType_FixedPoint;
          __ptr->nvclone = SUNNonlinSolInitialize_FixedPoint;
          __ptr->nvcloneempty = (_func_N_Vector_N_Vector *)0x0;
          __ptr->nvdestroy = SUNNonlinSolSolve_FixedPoint;
          __ptr->nvspace = SUNNonlinSolFree_FixedPoint;
          __ptr->nvgetarraypointer = SUNNonlinSolSetSysFn_FixedPoint;
          __ptr->nvsetarraypointer = (_func_void_realtype_ptr_N_Vector *)0x0;
          __ptr->nvlinearsum = (_func_void_realtype_N_Vector_realtype_N_Vector_N_Vector *)0x0;
          __ptr->nvconst = SUNNonlinSolSetConvTestFn_FixedPoint;
          __ptr->nvprod = SUNNonlinSolSetMaxIters_FixedPoint;
          __ptr->nvdiv = SUNNonlinSolGetNumIters_FixedPoint;
          __ptr->nvscale = SUNNonlinSolGetCurIter_FixedPoint;
          __ptr->nvabs = SUNNonlinSolGetNumConvFails_FixedPoint;
          memset(__s,0,0x98);
          *__s = 0;
          __s[1] = 0;
          *(int *)(__s + 2) = m;
          *(undefined4 *)(__s + 0x10) = 0;
          *(undefined4 *)((long)__s + 0x84) = 3;
          __s[0x11] = 0;
          __s[0x12] = 0;
          iVar1 = AllocateContent((SUNNonlinearSolver)y_local,y);
          if (iVar1 != 0) {
            y_local->content = (void *)0x0;
            y_local->ops = (_generic_N_Vector_Ops *)0x0;
            free(__s);
            free(__ptr);
            free(y_local);
            y_local = (N_Vector)0x0;
          }
        }
      }
    }
  }
  return (SUNNonlinearSolver)y_local;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_FixedPoint(N_Vector y, int m)
{
  SUNNonlinearSolver NLS;
  SUNNonlinearSolver_Ops ops;
  SUNNonlinearSolverContent_FixedPoint content;
  int retval;

  /* Check that the supplied N_Vector is non-NULL */
  if (y == NULL) return(NULL);

  /* Check that the supplied N_Vector supports all required operations */
  if ( (y->ops->nvclone     == NULL) ||
       (y->ops->nvdestroy   == NULL) ||
       (y->ops->nvscale     == NULL) ||
       (y->ops->nvlinearsum == NULL) ||
       (y->ops->nvdotprod   == NULL) )
    return(NULL);

  /* Create nonlinear linear solver */
  NLS = NULL;
  NLS = (SUNNonlinearSolver) malloc(sizeof *NLS);
  if (NLS == NULL) return(NULL);

  /* Create nonlinear solver operations structure */
  ops = NULL;
  ops = (SUNNonlinearSolver_Ops) malloc(sizeof *ops);
  if (ops == NULL) { free(NLS); return(NULL); }

  /* Create nonlinear solver content structure */
  content = NULL;
  content = (SUNNonlinearSolverContent_FixedPoint) malloc(sizeof *content);
  if (content == NULL) { free(ops); free(NLS); return(NULL); }

  /* Attach content and ops */
  NLS->content = content;
  NLS->ops     = ops;

  /* Attach operations */
  ops->gettype         = SUNNonlinSolGetType_FixedPoint;
  ops->initialize      = SUNNonlinSolInitialize_FixedPoint;
  ops->setup           = NULL;  /* no setup needed */
  ops->solve           = SUNNonlinSolSolve_FixedPoint;
  ops->free            = SUNNonlinSolFree_FixedPoint;
  ops->setsysfn        = SUNNonlinSolSetSysFn_FixedPoint;
  ops->setlsetupfn     = NULL;  /* no lsetup needed */
  ops->setlsolvefn     = NULL;  /* no lsolve needed */
  ops->setctestfn      = SUNNonlinSolSetConvTestFn_FixedPoint;
  ops->setmaxiters     = SUNNonlinSolSetMaxIters_FixedPoint;
  ops->getnumiters     = SUNNonlinSolGetNumIters_FixedPoint;
  ops->getcuriter      = SUNNonlinSolGetCurIter_FixedPoint;
  ops->getnumconvfails = SUNNonlinSolGetNumConvFails_FixedPoint;

  /* Initialize all components of content to 0/NULL */
  memset(content, 0, sizeof(struct _SUNNonlinearSolverContent_FixedPoint));

  /* Fill general content */
  content->Sys        = NULL;
  content->CTest      = NULL;
  content->m          = m;
  content->curiter    = 0;
  content->maxiters   = 3;
  content->niters     = 0;
  content->nconvfails = 0;

  /* Fill allocatable content */
  retval = AllocateContent(NLS, y);

  if (retval != SUN_NLS_SUCCESS) {
    NLS->content = NULL;
    NLS->ops = NULL;
    free(content);
    free(ops);
    free(NLS);
    return(NULL);
  }

  return(NLS);
}